

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recipient.c
# Opt level: O3

_Bool COSE_Recipient_SetKey_secret
                (HCOSE_RECIPIENT hRecipient,byte *rgbKey,int cbKey,byte *rgbKid,int cbKid,
                cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor *pcVar3;
  uint8_t *data;
  cn_cbor *cb_value;
  COSE_RecipientInfo *p;
  cn_cbor_errback cbor_error;
  cn_cbor *local_48;
  cn_cbor_errback local_40;
  uint8_t *local_38;
  
  if (hRecipient == (HCOSE_RECIPIENT)0x0) {
LAB_00198297:
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_HANDLE;
    }
    return false;
  }
  _Var1 = _COSE_IsInList(RecipientRoot,(COSE *)hRecipient);
  if (!_Var1) goto LAB_00198297;
  if (rgbKey == (byte *)0x0) {
LAB_0019828a:
    if (perr == (cose_errback *)0x0) {
      return false;
    }
    perr->err = COSE_ERR_INVALID_PARAMETER;
    return false;
  }
  pcVar3 = _COSE_map_get_int((COSE *)hRecipient,1,7,perr);
  if (pcVar3 == (cn_cbor *)0x0) {
    local_48 = cn_cbor_int_create(-6,&local_40);
    if (local_48 == (cn_cbor *)0x0) {
      if (perr == (cose_errback *)0x0) {
        return false;
      }
      cVar2 = _MapFromCBOR(local_40);
      perr->err = cVar2;
      return false;
    }
    _Var1 = COSE_Recipient_map_put_int(hRecipient,1,local_48,2,perr);
    if (_Var1) goto LAB_001982f1;
LAB_00198389:
    cb_value = (cn_cbor *)0x0;
    data = (uint8_t *)0x0;
LAB_001984e3:
    cn_cbor_free(local_48);
    local_48 = cb_value;
LAB_001984ec:
    if (local_48 != (cn_cbor *)0x0) goto LAB_001984f1;
  }
  else {
    if ((pcVar3->type != CN_CBOR_INT) || ((pcVar3->v).bytes != (uint8_t *)0xfffffffffffffffa))
    goto LAB_0019828a;
LAB_001982f1:
    if (cbKid < 1) {
      local_48 = (cn_cbor *)0x0;
LAB_00198399:
      data = (uint8_t *)calloc((long)cbKey,1);
      if (data == (uint8_t *)0x0) {
        if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_OUT_OF_MEMORY;
        }
        data = (uint8_t *)0x0;
      }
      else {
        memcpy(data,rgbKey,(long)cbKey);
        pcVar3 = cn_cbor_map_create(&local_40);
        if (pcVar3 != (cn_cbor *)0x0) {
          cb_value = cn_cbor_int_create(4,&local_40);
          if (cb_value == (cn_cbor *)0x0) {
LAB_001984cf:
            cb_value = (cn_cbor *)0x0;
LAB_001984d2:
            local_48 = pcVar3;
            if (perr == (cose_errback *)0x0) goto LAB_001984e3;
            cVar2 = _MapFromCBOR(local_40);
          }
          else {
            _Var1 = cn_cbor_mapput_int(pcVar3,1,cb_value,&local_40);
            if (!_Var1) goto LAB_001984d2;
            cb_value = cn_cbor_data_create(data,cbKey,&local_40);
            if (cb_value == (cn_cbor *)0x0) goto LAB_001984cf;
            _Var1 = cn_cbor_mapput_int(pcVar3,-1,cb_value,&local_40);
            if (!_Var1) {
              data = (uint8_t *)0x0;
              goto LAB_001984d2;
            }
            _Var1 = _COSE_IsInList(RecipientRoot,(COSE *)hRecipient);
            if (_Var1) {
              *(cn_cbor **)(hRecipient + 0x78) = pcVar3;
              return true;
            }
            cVar2 = COSE_ERR_INVALID_HANDLE;
            cb_value = (cn_cbor *)0x0;
            data = (uint8_t *)0x0;
            local_48 = pcVar3;
            if (perr == (cose_errback *)0x0) goto LAB_00198389;
          }
          perr->err = cVar2;
          local_48 = pcVar3;
          goto LAB_001984e3;
        }
        if (perr != (cose_errback *)0x0) {
          cVar2 = _MapFromCBOR(local_40);
          perr->err = cVar2;
        }
      }
      goto LAB_001984ec;
    }
    local_38 = (uint8_t *)calloc((ulong)(uint)cbKid,1);
    if (local_38 == (uint8_t *)0x0) {
      if (perr == (cose_errback *)0x0) {
        return false;
      }
      perr->err = COSE_ERR_OUT_OF_MEMORY;
      return false;
    }
    memcpy(local_38,rgbKid,(ulong)(uint)cbKid);
    local_48 = cn_cbor_data_create(local_38,cbKid,&local_40);
    data = local_38;
    if (local_48 == (cn_cbor *)0x0) {
      if (perr != (cose_errback *)0x0) {
        cVar2 = _MapFromCBOR(local_40);
        perr->err = cVar2;
      }
      goto LAB_00198505;
    }
    _Var1 = COSE_Recipient_map_put_int(hRecipient,4,local_48,2,perr);
    if (_Var1) goto LAB_00198399;
    data = (uint8_t *)0x0;
LAB_001984f1:
    cn_cbor_free(local_48);
  }
  if (data == (uint8_t *)0x0) {
    return false;
  }
LAB_00198505:
  free(data);
  return false;
}

Assistant:

bool COSE_Recipient_SetKey_secret(HCOSE_RECIPIENT hRecipient, const byte * rgbKey, int cbKey, const byte * rgbKid, int cbKid, cose_errback * perr)
{
	COSE_RecipientInfo * p;
	cn_cbor * cn_Temp = NULL;
	cn_cbor * cnTemp = NULL;
	cn_cbor_errback cbor_error;
	byte * pbTemp = NULL;
	byte * pbKey = NULL;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = NULL;
#endif

	CHECK_CONDITION(IsValidRecipientHandle(hRecipient), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(rgbKey != NULL, COSE_ERR_INVALID_PARAMETER);

	p = (COSE_RecipientInfo *)hRecipient;

#ifdef USE_CBOR_CONTEXT
	context = &p->m_encrypt.m_message.m_allocContext;
#endif

	cn_cbor * cnAlg = _COSE_map_get_int(&p->m_encrypt.m_message, COSE_Header_Algorithm, COSE_BOTH, perr);
	if (cnAlg != NULL) {
		CHECK_CONDITION(cnAlg->type == CN_CBOR_INT && cnAlg->v.sint == COSE_Algorithm_Direct, COSE_ERR_INVALID_PARAMETER);
	}
	else {
		cn_Temp = cn_cbor_int_create(COSE_Algorithm_Direct, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(cn_Temp != NULL, cbor_error);
		if (!COSE_Recipient_map_put_int(hRecipient, COSE_Header_Algorithm, cn_Temp, COSE_UNPROTECT_ONLY, perr)) goto errorReturn;
		cn_Temp = NULL;
	}

	if (cbKid > 0) {
		pbTemp = (byte *)COSE_CALLOC(cbKid, 1, context);
		CHECK_CONDITION(pbTemp != NULL, COSE_ERR_OUT_OF_MEMORY);

		memcpy(pbTemp, rgbKid, cbKid);
		cnTemp = cn_cbor_data_create(pbTemp, cbKid, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(cnTemp != NULL, cbor_error);
		pbTemp = NULL;

		if (!COSE_Recipient_map_put_int(hRecipient, COSE_Header_KID, cnTemp, COSE_UNPROTECT_ONLY, perr)) goto errorReturn;
	}

	pbKey = (byte *)COSE_CALLOC(cbKey, 1, context);
	CHECK_CONDITION(pbKey != NULL, COSE_ERR_OUT_OF_MEMORY);

	memcpy(pbKey, rgbKey, cbKey);

	cn_Temp = cn_cbor_map_create(CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cn_Temp != NULL, cbor_error);

	cnTemp = cn_cbor_int_create(4, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cnTemp != NULL, cbor_error);
	CHECK_CONDITION_CBOR(cn_cbor_mapput_int(cn_Temp, COSE_Key_Type, cnTemp, CBOR_CONTEXT_PARAM_COMMA &cbor_error), cbor_error);
	cnTemp = NULL;

	cnTemp = cn_cbor_data_create(pbKey, cbKey, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cnTemp != NULL, cbor_error);
	pbKey = NULL;
	CHECK_CONDITION_CBOR(cn_cbor_mapput_int(cn_Temp, -1, cnTemp, CBOR_CONTEXT_PARAM_COMMA &cbor_error), cbor_error);
	cnTemp = NULL;

	if (!COSE_Recipient_SetKey(hRecipient, cn_Temp, perr)) goto errorReturn;
	cn_Temp = NULL;

	return true;

errorReturn:
	if (cn_Temp != NULL) CN_CBOR_FREE(cn_Temp, context);
	if (cnTemp != NULL) CN_CBOR_FREE(cnTemp, context);
	if (pbTemp != NULL) COSE_FREE(pbTemp, context);
	if (pbKey != NULL) COSE_FREE(pbKey, context);
	return false;
}